

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O1

_Bool Hacl_P256_validate_private_key(uint8_t *private_key)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong a;
  uint64_t t1;
  ulong a_00;
  
  uVar5 = *(ulong *)(private_key + 0x18);
  a_00 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
         (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
         (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
  uVar5 = *(ulong *)(private_key + 0x10);
  a = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
      (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
      (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
  uVar5 = *(ulong *)private_key;
  uVar6 = *(ulong *)(private_key + 8);
  uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
          (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
          (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
  uVar5 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
          (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
          (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
  uVar1 = FStar_UInt64_eq_mask(a_00,0);
  uVar2 = FStar_UInt64_eq_mask(a,0);
  uVar3 = FStar_UInt64_eq_mask(uVar6,0);
  uVar4 = FStar_UInt64_eq_mask(uVar5,0);
  return (uVar5 < 0xffffffff00000000 ||
         uVar5 + 0x100000000 <
         (ulong)(uVar6 != 0xffffffffffffffff ||
                uVar6 + 1 <
                (ulong)(a < 0xbce6faada7179e84 ||
                       a + 0x4319055258e8617c < (ulong)(a_00 < 0xf3b9cac2fc632551)))) &&
         (uVar4 & uVar3 & uVar2 & uVar1) == 0;
}

Assistant:

bool Hacl_P256_validate_private_key(uint8_t *private_key)
{
  uint64_t bn_sk[4U] = { 0U };
  bn_from_bytes_be4(bn_sk, private_key);
  uint64_t res = bn_is_lt_order_and_gt_zero_mask4(bn_sk);
  return res == 0xFFFFFFFFFFFFFFFFULL;
}